

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printAddrModeTBB(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  char *pcVar5;
  undefined4 in_register_00000034;
  SStream *ss;
  
  ss = (SStream *)CONCAT44(in_register_00000034,Op);
  op = MCInst_getOperand(MI,0);
  op_00 = MCInst_getOperand(MI,1);
  SStream_concat0(ss,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  pcVar5 = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(ss,pcVar5);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) = uVar4;
  }
  SStream_concat0(ss,", ");
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op_00);
  pcVar5 = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(ss,pcVar5);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCOperand_getReg(op_00);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x49) = uVar4;
  }
  SStream_concat0(ss,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printAddrModeTBB(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op+1);
	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	SStream_concat0(O, ", ");
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = MCOperand_getReg(MO2);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}